

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O0

double __thiscall
HighsMipSolverData::limitsToGap
          (HighsMipSolverData *this,double use_lower_bound,double use_upper_bound,double *lb,
          double *ub)

{
  double dVar1;
  double *pdVar2;
  double *in_RDX;
  double *in_RSI;
  long *in_RDI;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double in_XMM1_Qa;
  double gap;
  double offset;
  double local_38;
  
  dVar1 = *(double *)(*(long *)(*in_RDI + 0x10) + 0xf8);
  *in_RSI = in_XMM0_Qa + dVar1;
  std::abs((int)in_RDI);
  if (extraout_XMM0_Qa <= (double)in_RDI[0xcc5]) {
    *in_RSI = 0.0;
  }
  *in_RDX = INFINITY;
  local_38 = INFINITY;
  if ((in_XMM1_Qa != INFINITY) || (NAN(in_XMM1_Qa))) {
    *in_RDX = in_XMM1_Qa + dVar1;
    if (ABS(*in_RDX) <= (double)in_RDI[0xcc5]) {
      *in_RDX = 0.0;
    }
    pdVar2 = std::min<double>(in_RDX,in_RSI);
    *in_RSI = *pdVar2;
    if ((*in_RDX != 0.0) || (NAN(*in_RDX))) {
      local_38 = (*in_RDX - *in_RSI) / ABS(*in_RDX);
    }
    else {
      local_38 = (double)(~-(ulong)(*in_RSI == 0.0) & 0x7ff0000000000000);
    }
  }
  return local_38;
}

Assistant:

double HighsMipSolverData::limitsToGap(const double use_lower_bound,
                                       const double use_upper_bound, double& lb,
                                       double& ub) const {
  double offset = mipsolver.model_->offset_;
  lb = use_lower_bound + offset;
  if (std::abs(lb) <= epsilon) lb = 0;
  ub = kHighsInf;
  double gap = kHighsInf;
  if (use_upper_bound != kHighsInf) {
    ub = use_upper_bound + offset;
    if (std::fabs(ub) <= epsilon) ub = 0;
    lb = std::min(ub, lb);
    if (ub == 0.0)
      gap = lb == 0.0 ? 0.0 : kHighsInf;
    else
      gap = (ub - lb) / fabs(ub);
  }
  return gap;
}